

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_2,_3>,_tcu::Matrix<double,_3,_2>_>::call
          (unary<tcu::Matrix<double,_2,_3>,_tcu::Matrix<double,_3,_2>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  GLdouble *data;
  long lVar8;
  long lVar9;
  long lVar10;
  undefined1 *puVar11;
  bool bVar12;
  uint uVar13;
  Matrix<double,_3,_2> arg;
  Matrix<double,_2,_3> result;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98 [11];
  undefined1 local_40 [48];
  
  puVar7 = &local_a8;
  puVar6 = local_98 + 4;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  lVar8 = 0;
  lVar9 = 0;
  do {
    lVar10 = 0;
    do {
      uVar13 = 0x3ff00000;
      if (lVar8 != lVar10) {
        uVar13 = 0;
      }
      *(ulong *)((long)puVar6 + lVar10) = (ulong)uVar13 << 0x20;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x30);
    puVar6 = puVar6 + 1;
    lVar8 = lVar8 + 0x10;
    bVar12 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar12);
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  lVar9 = 0;
  lVar8 = 0;
  do {
    lVar10 = 0;
    do {
      uVar13 = 0x3ff00000;
      if (lVar9 != lVar10) {
        uVar13 = 0;
      }
      *(ulong *)((long)puVar7 + lVar10) = (ulong)uVar13 << 0x20;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 == 0x18);
    lVar8 = lVar8 + 1;
    puVar7 = (undefined8 *)((long)puVar7 + 8);
    lVar9 = lVar9 + 0x18;
  } while (lVar8 != 3);
  lVar9 = 0;
  do {
    *(undefined8 *)((long)local_98 + lVar9) = *(undefined8 *)((long)argument_src + lVar9 + 0x10);
    puVar1 = (undefined4 *)((long)argument_src + lVar9);
    uVar2 = puVar1[1];
    uVar3 = puVar1[2];
    uVar4 = puVar1[3];
    *(undefined4 *)((long)&local_a8 + lVar9) = *puVar1;
    *(undefined4 *)((long)&local_a8 + lVar9 + 4) = uVar2;
    *(undefined4 *)((long)&uStack_a0 + lVar9) = uVar3;
    *(undefined4 *)((long)&uStack_a0 + lVar9 + 4) = uVar4;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 == 0x18);
  puVar11 = local_40;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(puVar11,&local_a8);
  puVar6 = local_98 + 4;
  lVar9 = 0;
  do {
    lVar8 = 0;
    do {
      *(undefined8 *)((long)puVar6 + lVar8) = *(undefined8 *)(puVar11 + lVar8);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x30);
    puVar6 = puVar6 + 1;
    puVar11 = puVar11 + 8;
    bVar12 = lVar9 == 0;
    lVar9 = lVar9 + 1;
  } while (bVar12);
  lVar9 = 0;
  do {
    uVar5 = *(undefined8 *)((long)local_98 + lVar9 + 0x28);
    *(undefined8 *)((long)result_dst + lVar9) = *(undefined8 *)((long)local_98 + lVar9 + 0x20);
    ((undefined8 *)((long)result_dst + lVar9))[1] = uVar5;
    lVar9 = lVar9 + 0x10;
  } while (lVar9 != 0x30);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}